

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  __int32_t **pp_Var3;
  double dVar4;
  double value;
  char c [3];
  
  do {
    printf("Please input a value: ");
    pcVar2 = fgets(c,0x32,_stdin);
    if (pcVar2 == (char *)0x0) {
LAB_00101270:
      putchar(10);
      return 0;
    }
    iVar1 = __isoc99_sscanf(c,"%lf",&value);
    if (iVar1 != 0) {
      printf("Is this value in celsius or fahrenheit? [C/f] ");
      pcVar2 = fgets(c,3,_stdin);
      if (pcVar2 != (char *)0x0) {
        pp_Var3 = __ctype_toupper_loc();
        if (((long)c[0] == 10) || ((*pp_Var3)[c[0]] == 0x43)) {
          dVar4 = (value * 9.0) / 5.0 + 32.0;
          pcVar2 = anon_var_dwarf_9b;
        }
        else {
          dVar4 = ((value + -32.0) * 5.0) / 9.0;
          pcVar2 = anon_var_dwarf_b1;
        }
        printf(pcVar2,value,dVar4);
        return 0;
      }
      goto LAB_00101270;
    }
    puts("Invalid number!");
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  double value;

  while (true) {
    printf("Please input a value: ");
    char str[50];
    if (fgets(str, 50, stdin) == NULL) {
      printf("\n");
      return 0;
    }
    if (sscanf(str, "%lf", &value)) break;
    else printf("Invalid number!\n");
  }

  bool is_celsius;
  printf("Is this value in celsius or fahrenheit? [C/f] ");
  char c[3];
  if (fgets(c, 3, stdin) != NULL) {
    is_celsius = toupper(*c) == 'C' || *c == '\n';
  } else {
    printf("\n");
    return 0;
  }

  if (is_celsius) {
    printf("%.3lf°C = %.3lf°F\n", value, c2f(value));
  } else {
    printf("%.3lf°F = %.3lf°C\n", value, f2c(value));
  }

  return 0;
}